

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Model * gvr::createModelFromContours(char *name,double scale,double height)

{
  ImageIO *this;
  Mesh *this_00;
  vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> pl;
  ImageU8 image;
  
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(&image,0,0,1);
  this = gimage::getImageIO();
  gimage::ImageIO::load(this,&image,name,1,0,0,-1,-1);
  pl.super__Vector_base<gimage::Polygon,_std::allocator<gimage::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pl.super__Vector_base<gimage::Polygon,_std::allocator<gimage::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pl.super__Vector_base<gimage::Polygon,_std::allocator<gimage::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gimage::extractContours(&pl,&image,0.25);
  this_00 = (Mesh *)operator_new(0xc0);
  Mesh::Mesh(this_00);
  createMeshFromContours(this_00,&pl,scale,height);
  std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::~vector(&pl);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&image);
  return (Model *)this_00;
}

Assistant:

Model *createModelFromContours(const char *name, double scale, double height)
{
  // load image

  gimage::ImageU8 image;
  gimage::getImageIO().load(image, name);

  // extract contours

  std::vector<gimage::Polygon> pl;
  extractContours(pl, image, 0.25f);

  // create mesh from contours

  Mesh *mesh=new Mesh();

  try
  {
    createMeshFromContours(mesh, pl, scale, height);
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  return mesh;
}